

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImFont::RenderChar(ImFont *this,ImDrawList *draw_list,float size,ImVec2 pos,ImU32 col,
                  unsigned_short c)

{
  Glyph *pGVar1;
  float fVar2;
  float fVar3;
  float local_6c;
  ImVec2 local_5c;
  ImVec2 local_54;
  ImVec2 local_4c;
  ImVec2 pos_br;
  ImVec2 pos_tl;
  float scale;
  Glyph *glyph;
  unsigned_short c_local;
  ImU32 col_local;
  float size_local;
  ImDrawList *draw_list_local;
  ImFont *this_local;
  ImVec2 pos_local;
  
  if ((((c != 0x20) && (c != 9)) && (c != 10)) &&
     ((c != 0xd && (pGVar1 = FindGlyph(this,c), pGVar1 != (Glyph *)0x0)))) {
    if (size < 0.0) {
      local_6c = 1.0;
    }
    else {
      local_6c = size / this->FontSize;
    }
    this_local._0_4_ = pos.x;
    fVar2 = (float)(int)this_local._0_4_ + (this->DisplayOffset).x;
    this_local._4_4_ = pos.y;
    fVar3 = (float)(int)this_local._4_4_ + (this->DisplayOffset).y;
    ImVec2::ImVec2(&pos_br,pGVar1->X0 * local_6c + fVar2,pGVar1->Y0 * local_6c + fVar3);
    ImVec2::ImVec2(&local_4c,pGVar1->X1 * local_6c + fVar2,pGVar1->Y1 * local_6c + fVar3);
    ImDrawList::PrimReserve(draw_list,6,4);
    ImVec2::ImVec2(&local_54,pGVar1->U0,pGVar1->V0);
    ImVec2::ImVec2(&local_5c,pGVar1->U1,pGVar1->V1);
    ImDrawList::PrimRectUV(draw_list,&pos_br,&local_4c,&local_54,&local_5c,col);
  }
  return;
}

Assistant:

void ImFont::RenderChar(ImDrawList* draw_list, float size, ImVec2 pos, ImU32 col, unsigned short c) const
{
    if (c == ' ' || c == '\t' || c == '\n' || c == '\r') // Match behavior of RenderText(), those 4 codepoints are hard-coded.
        return;
    if (const Glyph* glyph = FindGlyph(c))
    {
        float scale = (size >= 0.0f) ? (size / FontSize) : 1.0f;
        pos.x = (float)(int)pos.x + DisplayOffset.x;
        pos.y = (float)(int)pos.y + DisplayOffset.y;
        ImVec2 pos_tl(pos.x + glyph->X0 * scale, pos.y + glyph->Y0 * scale);
        ImVec2 pos_br(pos.x + glyph->X1 * scale, pos.y + glyph->Y1 * scale);
        draw_list->PrimReserve(6, 4);
        draw_list->PrimRectUV(pos_tl, pos_br, ImVec2(glyph->U0, glyph->V0), ImVec2(glyph->U1, glyph->V1), col);
    }
}